

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVector<llvm::DWARFDebugLoc::Entry,_2U>::SmallVector
          (SmallVector<llvm::DWARFDebugLoc::Entry,_2U> *this,
          SmallVector<llvm::DWARFDebugLoc::Entry,_2U> *RHS)

{
  (this->super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>).
  super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>.
  super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.BeginX =
       &this->super_SmallVectorStorage<llvm::DWARFDebugLoc::Entry,_2U>;
  (this->super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>).
  super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>.
  super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.Size = 0;
  (this->super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>).
  super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>.
  super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.Capacity =
       2;
  if ((RHS->super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>).
      super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>.
      super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.Size
      != 0) {
    SmallVectorImpl<llvm::DWARFDebugLoc::Entry>::operator=
              (&this->super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>,
               &RHS->super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>);
  }
  return;
}

Assistant:

SmallVector(SmallVector &&RHS) : SmallVectorImpl<T>(N) {
    if (!RHS.empty())
      SmallVectorImpl<T>::operator=(::std::move(RHS));
  }